

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config,string *objectFileName)

{
  cmGeneratorTarget *pcVar1;
  pointer pcVar2;
  cmLocalNinjaGenerator *pcVar3;
  pointer pcVar4;
  cmMakefile *pcVar5;
  cmNinjaTargetGenerator *pcVar6;
  undefined8 uVar7;
  int iVar8;
  string *psVar9;
  cmValue cVar10;
  string *psVar11;
  string *psVar12;
  iterator iVar13;
  cmFileSet *pcVar14;
  size_type sVar15;
  cmRulePlaceholderExpander *pcVar16;
  pointer arch;
  bool bVar17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string flag;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string COMPILE_OPTIONS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string COMPILE_FLAGS;
  string filterArch;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string pchOptions;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pchSources;
  undefined1 local_3f8 [32];
  cmNinjaTargetGenerator *local_3d8;
  string *local_3d0;
  string *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  undefined1 local_3b8 [32];
  string local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  string local_360;
  string local_340;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_320;
  char local_300;
  string *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  cmGeneratorExpressionInterpreter local_230;
  undefined1 local_1c0 [32];
  _Alloc_hider local_1a0;
  char *local_198;
  undefined1 local_190 [16];
  char *local_180;
  char *local_178;
  pointer local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  pointer local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = (language->_M_dataplus)._M_p;
  local_320._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)((long)&local_320 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar2,pcVar2 + language->_M_string_length);
  local_300 = '\x01';
  cmGeneratorTarget::GetAppleArchs
            (&local_378,pcVar1,config,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_320._M_value);
  local_3c8 = __return_storage_ptr__;
  if ((local_300 == '\x01') &&
     (local_300 = '\0',
     local_320._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_320 + 0x10))) {
    operator_delete((void *)local_320._M_value._M_dataplus._M_p,local_320._16_8_ + 1);
  }
  local_3d8 = this;
  local_3d0 = config;
  local_2f8 = objectFileName;
  if (local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&local_378);
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  local_340._M_string_length = 0;
  local_340.field_2._M_local_buf[0] = '\0';
  if (local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    arch = local_378.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmGeneratorTarget::GetPchSource
                ((string *)&local_230,(local_3d8->super_cmCommonTargetGenerator).GeneratorTarget,
                 local_3d0,language,arch);
      psVar9 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      if ((local_230.GeneratorExpression.Backtrace.
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr == (element_type *)psVar9->_M_string_length) &&
         ((local_230.GeneratorExpression.Backtrace.
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr == (element_type *)0x0 ||
          (iVar8 = bcmp(local_230.GeneratorExpression.CMakeInstance,(psVar9->_M_dataplus)._M_p,
                        (size_t)local_230.GeneratorExpression.Backtrace.
                                super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr), iVar8 == 0)))) {
        std::__cxx11::string::_M_assign((string *)&local_340);
      }
      if (local_230.GeneratorExpression.Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   arch);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c0);
        if (local_1a0._M_p != local_190) {
          operator_delete(local_1a0._M_p,local_190._0_8_ + 1);
        }
        if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
          operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
        }
      }
      if (local_230.GeneratorExpression.CMakeInstance !=
          (cmake *)&local_230.GeneratorExpression.Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount) {
        operator_delete(local_230.GeneratorExpression.CMakeInstance,
                        (ulong)((long)&(local_230.GeneratorExpression.Backtrace.
                                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                        TopEntry.
                                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      arch = arch + 1;
    } while (arch != local_378.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar9 = local_3c8;
  pcVar6 = local_3d8;
  local_3c0 = &local_3c8->field_2;
  (local_3c8->_M_dataplus)._M_p = (pointer)local_3c0;
  local_3c8->_M_string_length = 0;
  (local_3c8->field_2)._M_local_buf[0] = '\0';
  cmGeneratorTarget::AddExplicitLanguageFlags
            ((local_3d8->super_cmCommonTargetGenerator).GeneratorTarget,local_3c8,source);
  if (psVar9->_M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar9);
  }
  cmCommonTargetGenerator::GetFlags
            ((string *)local_1c0,&pcVar6->super_cmCommonTargetGenerator,language,local_3d0,
             &local_340);
  std::__cxx11::string::_M_append((char *)psVar9,local_1c0._0_8_);
  pcVar2 = local_1c0 + 0x10;
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
  }
  iVar8 = std::__cxx11::string::compare((char *)language);
  if (iVar8 == 0) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&pcVar6->super_cmCommonTargetGenerator,psVar9,source);
    cmCommonTargetGenerator::AppendFortranPreprocessFlags
              (&pcVar6->super_cmCommonTargetGenerator,psVar9,source,NO);
  }
  pcVar3 = pcVar6->LocalGenerator;
  pcVar4 = (local_3d0->_M_dataplus)._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar4,pcVar4 + local_3d0->_M_string_length);
  pcVar1 = (pcVar6->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar4 = (language->_M_dataplus)._M_p;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar4,pcVar4 + language->_M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_230,(cmLocalGenerator *)pcVar3,&local_250,pcVar1,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  psVar9 = local_3c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"COMPILE_FLAGS","");
  cVar10 = cmSourceFile::GetProperty(source,&local_360);
  if (cVar10.Value != (string *)0x0) {
    pcVar3 = pcVar6->LocalGenerator;
    pcVar4 = ((cVar10.Value)->_M_dataplus)._M_p;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar4,pcVar4 + (cVar10.Value)->_M_string_length);
    psVar11 = cmGeneratorExpressionInterpreter::Evaluate(&local_230,&local_290,&local_360);
    (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[7])(pcVar3,psVar9,psVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
  }
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"COMPILE_OPTIONS","");
  cVar10 = cmSourceFile::GetProperty(source,&local_398);
  if (cVar10.Value != (string *)0x0) {
    pcVar3 = pcVar6->LocalGenerator;
    pcVar4 = ((cVar10.Value)->_M_dataplus)._M_p;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,pcVar4,pcVar4 + (cVar10.Value)->_M_string_length);
    psVar11 = cmGeneratorExpressionInterpreter::Evaluate(&local_230,&local_2b0,&local_398);
    cmLocalGenerator::AppendCompileOptions((cmLocalGenerator *)pcVar3,psVar9,psVar11,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68._M_element_count == 0) {
    bVar17 = false;
  }
  else {
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,"SKIP_PRECOMPILE_HEADERS","");
    cVar10 = cmSourceFile::GetProperty(source,&local_2d0);
    bVar17 = cVar10.Value == (string *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
  }
  psVar11 = local_3d0;
  pcVar6 = local_3d8;
  if (!bVar17) goto LAB_003ff984;
  local_1c0._8_8_ = (char *)0x0;
  local_1c0._16_8_ = local_1c0._16_8_ & 0xffffffffffffff00;
  local_1c0._0_8_ = pcVar2;
  psVar12 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  iVar13 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&local_68,psVar12);
  if (iVar13.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_3b8._8_8_ = 0;
    local_3b8[0x10] = '\0';
    local_3b8._0_8_ = (cmRulePlaceholderExpander *)(local_3b8 + 0x10);
    cmGeneratorTarget::GetPchUseCompileOptions
              ((string *)local_3f8,(pcVar6->super_cmCommonTargetGenerator).GeneratorTarget,psVar11,
               language,(string *)local_3b8);
    std::__cxx11::string::operator=((string *)local_1c0,(string *)local_3f8);
    if ((cmRulePlaceholderExpander *)local_3f8._0_8_ !=
        (cmRulePlaceholderExpander *)(local_3f8 + 0x10)) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    if ((cmRulePlaceholderExpander *)local_3b8._0_8_ !=
        (cmRulePlaceholderExpander *)(local_3b8 + 0x10)) {
      sVar15 = CONCAT71(local_3b8._17_7_,local_3b8[0x10]);
      pcVar16 = (cmRulePlaceholderExpander *)local_3b8._0_8_;
      goto LAB_003ff8e5;
    }
  }
  else {
    cmGeneratorTarget::GetPchCreateCompileOptions
              ((string *)local_3f8,(pcVar6->super_cmCommonTargetGenerator).GeneratorTarget,psVar11,
               language,(string *)
                        ((long)iVar13.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur + 0x28));
    std::__cxx11::string::operator=((string *)local_1c0,(string *)local_3f8);
    sVar15 = local_3f8._16_8_;
    pcVar16 = (cmRulePlaceholderExpander *)local_3f8._0_8_;
    if ((cmRulePlaceholderExpander *)local_3f8._0_8_ !=
        (cmRulePlaceholderExpander *)(local_3f8 + 0x10)) {
LAB_003ff8e5:
      operator_delete(pcVar16,sVar15 + 1);
    }
  }
  pcVar3 = pcVar6->LocalGenerator;
  local_2f0._M_allocated_capacity = (size_type)&local_2e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,local_1c0._0_8_,(char *)(local_1c0._8_8_ + local_1c0._0_8_));
  psVar12 = cmGeneratorExpressionInterpreter::Evaluate(&local_230,(string *)&local_2f0,&local_398);
  cmLocalGenerator::AppendCompileOptions((cmLocalGenerator *)pcVar3,psVar9,psVar12,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_allocated_capacity != &local_2e0) {
    operator_delete((void *)local_2f0._M_allocated_capacity,local_2e0._M_allocated_capacity + 1);
  }
  if ((pointer)local_1c0._0_8_ != pcVar2) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
  }
LAB_003ff984:
  pcVar14 = cmGeneratorTarget::GetFileSetForSource
                      ((pcVar6->super_cmCommonTargetGenerator).GeneratorTarget,psVar11,source);
  if (((pcVar14 != (cmFileSet *)0x0) && ((pcVar14->Type)._M_string_length == 0xb)) &&
     (iVar8 = bcmp((pcVar14->Type)._M_dataplus._M_p,"CXX_MODULES",0xb), iVar8 == 0)) {
    cmSourceFile::GetLanguage_abi_cxx11_((string *)local_1c0,source);
    uVar7 = local_1c0._0_8_;
    bVar17 = true;
    if ((char *)local_1c0._8_8_ == (char *)0x3) {
      iVar8 = bcmp((void *)local_1c0._0_8_,"CXX",3);
      bVar17 = iVar8 != 0;
    }
    if ((pointer)uVar7 != pcVar2) {
      operator_delete((void *)uVar7,local_1c0._16_8_ + 1);
    }
    pcVar6 = local_3d8;
    if (bVar17) {
      pcVar5 = (local_3d8->super_cmCommonTargetGenerator).Makefile;
      psVar11 = cmTarget::GetName_abi_cxx11_
                          (((local_3d8->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
      psVar12 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      local_1c0._0_8_ = (pointer)0x8;
      local_1c0._8_8_ = "Target \"";
      local_1c0._16_8_ = 0;
      local_1a0._M_p = (psVar11->_M_dataplus)._M_p;
      local_1c0._24_8_ = psVar11->_M_string_length;
      local_198 = (char *)0x0;
      local_190._0_8_ = 0x18;
      local_190._8_8_ = "\" contains the source\n  ";
      local_180 = (char *)0x0;
      local_170 = (psVar12->_M_dataplus)._M_p;
      local_178 = (char *)psVar12->_M_string_length;
      local_168 = (char *)0x0;
      local_160 = (char *)0x18;
      local_158 = "\nin a file set of type \"";
      local_150 = (char *)0x0;
      local_140 = (pcVar14->Type)._M_dataplus._M_p;
      local_148 = (char *)(pcVar14->Type)._M_string_length;
      local_138 = (char *)0x0;
      local_130 = (char *)0x35;
      local_128 = "\" but the source is not classified as a \"CXX\" source.";
      local_120 = (char *)0x0;
      views._M_len = 7;
      views._M_array = (iterator)local_1c0;
      cmCatViews((string *)local_3f8,views);
      cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,(string *)local_3f8);
      if ((cmRulePlaceholderExpander *)local_3f8._0_8_ !=
          (cmRulePlaceholderExpander *)(local_3f8 + 0x10)) {
        operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
      }
    }
    bVar17 = cmTarget::IsNormal(((pcVar6->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
    if (!bVar17) {
      pcVar5 = (pcVar6->super_cmCommonTargetGenerator).Makefile;
      local_1c0._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"CMAKE_CXX_MODULE_BMI_ONLY_FLAG","");
      psVar11 = cmMakefile::GetSafeDefinition(pcVar5,(string *)local_1c0);
      pcVar4 = (psVar11->_M_dataplus)._M_p;
      local_3f8._0_8_ = (cmRulePlaceholderExpander *)(local_3f8 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3f8,pcVar4,pcVar4 + psVar11->_M_string_length);
      if ((pointer)local_1c0._0_8_ != pcVar2) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
      }
      memset(local_1c0,0,0x158);
      local_140 = (local_2f8->_M_dataplus)._M_p;
      (*(pcVar6->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[6])(local_3b8);
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)local_3b8._0_8_,
                 (cmOutputConverter *)pcVar6->LocalGenerator,(string *)local_3f8,
                 (RuleVariables *)local_1c0);
      cmLocalGenerator::AppendCompileOptions
                ((cmLocalGenerator *)pcVar6->LocalGenerator,psVar9,(string *)local_3f8,(char *)0x0);
      if ((cmRulePlaceholderExpander *)local_3b8._0_8_ != (cmRulePlaceholderExpander *)0x0) {
        (**(code **)(*(long *)local_3b8._0_8_ + 8))();
      }
      if ((cmRulePlaceholderExpander *)local_3f8._0_8_ !=
          (cmRulePlaceholderExpander *)(local_3f8 + 0x10)) {
        operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.Language._M_dataplus._M_p != &local_230.Language.field_2) {
    operator_delete(local_230.Language._M_dataplus._M_p,
                    local_230.Language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.Config._M_dataplus._M_p != &local_230.Config.field_2) {
    operator_delete(local_230.Config._M_dataplus._M_p,
                    local_230.Config.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_230.CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&local_230.GeneratorExpression);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,
                    CONCAT71(local_340.field_2._M_allocated_capacity._1_7_,
                             local_340.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return psVar9;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language,
  const std::string& config, const std::string& objectFileName)
{
  std::unordered_map<std::string, std::string> pchSources;
  std::vector<std::string> architectures =
    this->GeneratorTarget->GetAppleArchs(config, language);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::string filterArch;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);
    if (pchSource == source->GetFullPath()) {
      filterArch = arch;
    }
    if (!pchSource.empty()) {
      pchSources.insert(std::make_pair(pchSource, arch));
    }
  }

  std::string flags;
  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  this->GeneratorTarget->AddExplicitLanguageFlags(flags, *source);

  if (!flags.empty()) {
    flags += " ";
  }
  flags += this->GetFlags(language, config, filterArch);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
    this->AppendFortranPreprocessFlags(flags, *source,
                                       PreprocessFlagsRequired::NO);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  // Add precompile headers compile options.
  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    std::string pchOptions;
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      pchOptions = this->GeneratorTarget->GetPchCreateCompileOptions(
        config, language, pchIt->second);
    } else {
      pchOptions =
        this->GeneratorTarget->GetPchUseCompileOptions(config, language);
    }

    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(pchOptions, COMPILE_OPTIONS));
  }

  auto const* fs = this->GeneratorTarget->GetFileSetForSource(config, source);
  if (fs && fs->GetType() == "CXX_MODULES"_s) {
    if (source->GetLanguage() != "CXX"_s) {
      this->GetMakefile()->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Target \"", this->GeneratorTarget->Target->GetName(),
                 "\" contains the source\n  ", source->GetFullPath(),
                 "\nin a file set of type \"", fs->GetType(),
                 R"(" but the source is not classified as a "CXX" source.)"));
    }

    if (!this->GeneratorTarget->Target->IsNormal()) {
      auto flag = this->GetMakefile()->GetSafeDefinition(
        "CMAKE_CXX_MODULE_BMI_ONLY_FLAG");
      cmRulePlaceholderExpander::RuleVariables compileObjectVars;
      compileObjectVars.Object = objectFileName.c_str();
      auto rulePlaceholderExpander =
        this->GetLocalGenerator()->CreateRulePlaceholderExpander();
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   flag, compileObjectVars);
      this->LocalGenerator->AppendCompileOptions(flags, flag);
    }
  }

  return flags;
}